

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O0

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::replaceAllUsesWith
          (SubgraphNode<dg::pta::PSNode> *this,PSNode *nd,bool removeDupl)

{
  bool bVar1;
  int iVar2;
  iterator this_00;
  reference ppPVar3;
  size_t sVar4;
  byte in_DL;
  PSNode *in_RDI;
  int e;
  int i;
  PSNode *user;
  iterator __end0;
  iterator __begin0;
  NodesVec *__range2;
  PSNode *in_stack_ffffffffffffffa8;
  PSNode *in_stack_ffffffffffffffb0;
  int iVar5;
  PSNode *nd_00;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_28;
  pointer *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = &(in_RDI->super_SubgraphNode<dg::pta::PSNode>).operands.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_28._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                  in_stack_ffffffffffffffa8);
  this_00 = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                      ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                       in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_28);
    nd_00 = *ppPVar3;
    iVar5 = 0;
    sVar4 = getOperandsNum((SubgraphNode<dg::pta::PSNode> *)0x15dd57);
    iVar2 = (int)sVar4;
    for (; iVar5 < iVar2; iVar5 = iVar5 + 1) {
      in_stack_ffffffffffffffa8 =
           getOperand((SubgraphNode<dg::pta::PSNode> *)in_stack_ffffffffffffffb0,
                      (size_t)in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffb0 = (PSNode *)0x0;
      if (in_stack_ffffffffffffffa8 != (PSNode *)0x0) {
        in_stack_ffffffffffffffb0 =
             (PSNode *)&in_stack_ffffffffffffffa8->super_SubgraphNode<dg::pta::PSNode>;
      }
      if (in_stack_ffffffffffffffb0 == in_RDI) {
        setOperand((SubgraphNode<dg::pta::PSNode> *)CONCAT44(iVar5,iVar2),(size_t)in_RDI,
                   in_stack_ffffffffffffffb0);
        addUser((SubgraphNode<dg::pta::PSNode> *)this_00._M_current,nd_00);
      }
    }
    if ((local_11 & 1) != 0) {
      removeDuplicitOperands(this);
    }
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_28);
  }
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::clear
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x15de1d);
  return;
}

Assistant:

void replaceAllUsesWith(NodeT *nd, bool removeDupl = true) {
        assert(nd != this && "Replacing uses of 'this' with 'this'");

        // Replace 'this' in every user with 'nd'.
        for (NodeT *user : users) {
            for (int i = 0, e = user->getOperandsNum(); i < e; ++i) {
                if (user->getOperand(i) == this) {
                    user->setOperand(i, nd);
                    // register that 'nd' is now used in 'user'
                    nd->addUser(user);
                }
            }

            if (removeDupl)
                user->removeDuplicitOperands();
        }

        users.clear();
    }